

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O1

void __thiscall PatternBlock::normalize(PatternBlock *this)

{
  uint *puVar1;
  pointer puVar2;
  uint *puVar3;
  uint *puVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  uint *puVar10;
  pointer puVar11;
  uint uVar12;
  int iVar13;
  size_t __n;
  uint *puVar14;
  long lVar15;
  long lVar16;
  pointer __src;
  pointer puVar17;
  
  if (this->nonzerosize < 1) {
    this->offset = 0;
    puVar17 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar17) {
      (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar17;
    }
    puVar17 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar17) {
      (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar17;
    }
  }
  else {
    puVar17 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
    puVar11 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    __src = puVar17;
    if (puVar17 != puVar2) {
      iVar7 = this->offset;
      do {
        iVar7 = iVar7 + 4;
        if (*__src != 0) break;
        __src = __src + 1;
        puVar11 = puVar11 + 1;
        this->offset = iVar7;
      } while (__src != puVar2);
    }
    if (__src != puVar17) {
      if ((long)puVar2 - (long)__src != 0) {
        memmove(puVar17,__src,(long)puVar2 - (long)__src);
      }
      puVar2 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar17 = (pointer)((long)puVar17 + ((long)puVar2 - (long)__src));
      if (puVar2 != puVar17) {
        (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar17;
      }
    }
    puVar17 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if (puVar11 != puVar17) {
      __n = (long)(this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar11;
      if (__n != 0) {
        memmove(puVar17,puVar11,__n);
      }
      puVar2 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      puVar17 = (pointer)((long)puVar17 + ((long)puVar2 - (long)puVar11));
      if (puVar2 != puVar17) {
        (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar17;
      }
    }
    puVar3 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar4 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (puVar3 != puVar4) {
      uVar12 = *puVar3;
      iVar7 = 0;
      if (uVar12 != 0) {
        do {
          iVar7 = iVar7 + 1;
          bVar5 = 0xff < uVar12;
          uVar12 = uVar12 >> 8;
        } while (bVar5);
      }
      iVar13 = iVar7 + -4;
      if (iVar13 != 0) {
        this->offset = this->offset - iVar13;
        lVar15 = (long)puVar4 - (long)puVar3 >> 2;
        if (lVar15 != 1) {
          lVar16 = 0;
          do {
            puVar3[lVar16] =
                 puVar3[lVar16 + 1] >> ((char)iVar7 * '\b' & 0x1fU) |
                 puVar3[lVar16] << ((char)iVar13 * -8 & 0x1fU);
            lVar16 = lVar16 + 1;
          } while (lVar15 + -1 != lVar16);
        }
        bVar9 = (char)iVar13 * -8;
        puVar4[-1] = puVar4[-1] << (bVar9 & 0x1f);
        puVar2 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar17 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        lVar15 = (long)puVar17 - (long)puVar2 >> 2;
        if (lVar15 != 1) {
          lVar16 = 0;
          do {
            puVar2[lVar16] =
                 puVar2[lVar16 + 1] >> ((byte)(iVar7 << 3) & 0x1f) |
                 puVar2[lVar16] << (bVar9 & 0x1f);
            lVar16 = lVar16 + 1;
          } while (lVar15 + -1 != lVar16);
        }
        puVar17 = puVar17 + -1;
        *puVar17 = *puVar17 << (bVar9 & 0x1f);
      }
      puVar17 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      puVar14 = puVar4;
      do {
        puVar10 = puVar14;
        if (puVar14 == puVar3) break;
        puVar10 = puVar14 + -1;
        puVar17 = puVar17 + -1;
        puVar1 = puVar14 + -1;
        puVar14 = puVar10;
      } while (*puVar1 == 0);
      if ((puVar10 + (puVar10 != puVar4) != puVar4) &&
         (puVar2 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
         puVar11 = (pointer)((long)(puVar10 + (puVar10 != puVar4)) + ((long)puVar2 - (long)puVar4)),
         puVar2 != puVar11)) {
        (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar11;
      }
      puVar2 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if ((puVar17 + (puVar10 != puVar4) != puVar2) &&
         (puVar11 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish,
         puVar17 = (pointer)((long)(puVar17 + (puVar10 != puVar4)) + ((long)puVar11 - (long)puVar2))
         , puVar11 != puVar17)) {
        (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar17;
      }
    }
    puVar17 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (puVar17 == puVar2) {
      this->offset = 0;
      this->nonzerosize = 0;
    }
    else {
      uVar8 = (int)puVar2 - (int)puVar17 & 0xfffffffc;
      this->nonzerosize = uVar8;
      uVar12 = puVar2[-1];
      if ((char)uVar12 == '\0') {
        do {
          uVar8 = uVar8 - 1;
          uVar6 = uVar12 & 0xff00;
          uVar12 = uVar12 >> 8;
        } while (uVar6 == 0);
        this->nonzerosize = uVar8;
      }
    }
  }
  return;
}

Assistant:

void PatternBlock::normalize(void)

{
  if (nonzerosize<=0) {		// Check if alwaystrue or alwaysfalse
    offset = 0;			// in which case we don't need mask and value
    maskvec.clear();
    valvec.clear();
    return;
  }
  vector<uintm>::iterator iter1,iter2;
  
  iter1 = maskvec.begin();	// Cut zeros from beginning of mask
  iter2 = valvec.begin();
  while((iter1 != maskvec.end())&&((*iter1)==0)) {
    iter1++;
    iter2++;
    offset += sizeof(uintm);
  }
  maskvec.erase(maskvec.begin(),iter1);
  valvec.erase(valvec.begin(),iter2);

  if (!maskvec.empty()) {
    int4 suboff = 0;		// Cut off unaligned zeros from beginning of mask
    uintm tmp = maskvec[0];
    while(tmp != 0) {
      suboff += 1;
      tmp >>= 8;
    }
    suboff = sizeof(uintm)-suboff;
    if (suboff != 0) {
      offset += suboff;		// Slide up maskvec by suboff bytes
      for(int4 i=0;i<maskvec.size()-1;++i) {
	tmp = maskvec[i] << (suboff*8);
	tmp |= (maskvec[i+1] >> ((sizeof(uintm)-suboff)*8));
	maskvec[i] = tmp;
      }
      maskvec.back() <<= suboff*8;
      for(int4 i=0;i<valvec.size()-1;++i) { // Slide up valvec by suboff bytes
	tmp = valvec[i] << (suboff*8);
	tmp |= (valvec[i+1] >> ((sizeof(uintm)-suboff)*8));
	valvec[i] = tmp;
      }
      valvec.back() <<= suboff*8;
    }
    
    iter1 = maskvec.end();	// Cut zeros from end of mask
    iter2 = valvec.end();
    while(iter1 != maskvec.begin()) {
      --iter1;
      --iter2;
      if ((*iter1) != 0) break; // Find last non-zero
    }
    if (iter1 != maskvec.end()) {
      iter1++;			// Find first zero, in last zero chain
      iter2++;
    }
    maskvec.erase(iter1,maskvec.end());
    valvec.erase(iter2,valvec.end());
  }

  if (maskvec.empty()) {
    offset = 0;
    nonzerosize = 0;		// Always true
    return;
  }
  nonzerosize = maskvec.size() * sizeof(uintm);
  uintm tmp = maskvec.back();	// tmp must be nonzero
  while( (tmp&0xff) == 0) {
    nonzerosize -= 1;
    tmp >>= 8;
  }
}